

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwUpdateGamepadMappings(char *string)

{
  GLFWbool GVar1;
  size_t sVar2;
  _GLFWmapping *p_Var3;
  size_t sVar4;
  char *in_RDI;
  _GLFWjoystick *js;
  _GLFWmapping *previous;
  _GLFWmapping mapping;
  size_t length;
  char line [1024];
  char *c;
  int jid;
  char *in_stack_fffffffffffffac8;
  _GLFWjoystick *p_Var5;
  _GLFWjoystick *in_stack_fffffffffffffad8;
  undefined1 local_428 [136];
  char *in_stack_fffffffffffffc60;
  _GLFWmapping *in_stack_fffffffffffffc68;
  char *local_20;
  int local_14;
  int local_4;
  
  local_20 = in_RDI;
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_4 = 0;
  }
  else {
    while (*local_20 != '\0') {
      if ((((*local_20 < '0') || ('9' < *local_20)) && ((*local_20 < 'a' || ('f' < *local_20)))) &&
         ((*local_20 < 'A' || ('F' < *local_20)))) {
        sVar2 = strcspn(local_20,"\r\n");
        sVar4 = strspn(local_20 + sVar2,"\r\n");
        local_20 = local_20 + sVar2 + sVar4;
      }
      else {
        sVar2 = strcspn(local_20,"\r\n");
        if (sVar2 < 0x400) {
          memset(&stack0xfffffffffffffadb,0,0xf5);
          memcpy(local_428,local_20,sVar2);
          local_428[sVar2] = 0;
          GVar1 = parseMapping(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
          if (GVar1 != 0) {
            p_Var3 = findMapping(in_stack_fffffffffffffac8);
            if (p_Var3 == (_GLFWmapping *)0x0) {
              _glfw.mappingCount = _glfw.mappingCount + 1;
              _glfw.mappings =
                   (_GLFWmapping *)realloc(_glfw.mappings,(long)_glfw.mappingCount * 0xf5);
              memcpy(_glfw.mappings + (_glfw.mappingCount + -1),&stack0xfffffffffffffadb,0xf5);
            }
            else {
              memcpy(p_Var3,&stack0xfffffffffffffadb,0xf5);
            }
          }
        }
        local_20 = local_20 + sVar2;
      }
    }
    for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
      p_Var5 = _glfw.joysticks + local_14;
      if (p_Var5->present != 0) {
        p_Var3 = findValidMapping(in_stack_fffffffffffffad8);
        p_Var5->mapping = p_Var3;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

GLFWAPI int glfwUpdateGamepadMappings(const char* string)
{
    int jid;
    const char* c = string;

    assert(string != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    while (*c)
    {
        if ((*c >= '0' && *c <= '9') ||
            (*c >= 'a' && *c <= 'f') ||
            (*c >= 'A' && *c <= 'F'))
        {
            char line[1024];

            const size_t length = strcspn(c, "\r\n");
            if (length < sizeof(line))
            {
                _GLFWmapping mapping = {{0}};

                memcpy(line, c, length);
                line[length] = '\0';

                if (parseMapping(&mapping, line))
                {
                    _GLFWmapping* previous = findMapping(mapping.guid);
                    if (previous)
                        *previous = mapping;
                    else
                    {
                        _glfw.mappingCount++;
                        _glfw.mappings =
                            realloc(_glfw.mappings,
                                    sizeof(_GLFWmapping) * _glfw.mappingCount);
                        _glfw.mappings[_glfw.mappingCount - 1] = mapping;
                    }
                }
            }

            c += length;
        }
        else
        {
            c += strcspn(c, "\r\n");
            c += strspn(c, "\r\n");
        }
    }

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        _GLFWjoystick* js = _glfw.joysticks + jid;
        if (js->present)
            js->mapping = findValidMapping(js);
    }

    return GLFW_TRUE;
}